

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void Util::writeXmlElement<ScrollBarVisibility>
               (stringstream *str,int indent,string *name,ScrollBarVisibility value)

{
  ostream *poVar1;
  undefined4 in_register_00000034;
  string local_40;
  
  getIndent_abi_cxx11_(&local_40,(Util *)CONCAT44(in_register_00000034,indent),(int)name);
  poVar1 = std::operator<<((ostream *)(str + 0x10),(string *)&local_40);
  poVar1 = std::operator<<(poVar1,"<");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,">");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,value);
  poVar1 = std::operator<<(poVar1,"</");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,">");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

static void writeXmlElement(std::stringstream &str, int indent, std::string name, T value)
	{
		str << getIndent(indent) << "<" << name << ">" << value << "</" << name << ">" << std::endl;
	}